

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_SecureChannelManager_renew
          (UA_SecureChannelManager *cm,UA_Connection *conn,UA_OpenSecureChannelRequest *request,
          UA_OpenSecureChannelResponse *response)

{
  UA_ByteString *p;
  UA_UInt32 UVar1;
  uint uVar2;
  UA_SecureChannel *pUVar3;
  UA_DateTime UVar4;
  undefined4 uVar5;
  uint uVar6;
  UA_StatusCode UVar7;
  undefined1 local_40 [8];
  timeval tv;
  
  pUVar3 = conn->channel;
  if (pUVar3 == (UA_SecureChannel *)0x0) {
    UVar7 = 0x80020000;
  }
  else {
    if ((pUVar3->nextSecurityToken).tokenId == 0) {
      (pUVar3->nextSecurityToken).channelId = (pUVar3->securityToken).channelId;
      UVar1 = cm->lastTokenId;
      cm->lastTokenId = UVar1 + 1;
      (pUVar3->nextSecurityToken).tokenId = UVar1;
      gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
      (pUVar3->nextSecurityToken).createdAt =
           (long)local_40 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
      uVar2 = (cm->server->config).maxSecurityTokenLifetime;
      uVar6 = request->requestedLifetime;
      if (uVar2 <= request->requestedLifetime) {
        uVar6 = uVar2;
      }
      if (uVar6 == 0) {
        uVar6 = uVar2;
      }
      (pUVar3->nextSecurityToken).revisedLifetime = uVar6;
    }
    p = &pUVar3->clientNonce;
    if ((pUVar3->clientNonce).data != (UA_Byte *)0x0) {
      deleteMembers_noInit(p,UA_TYPES + 0xe);
      p->length = 0;
      (pUVar3->clientNonce).data = (UA_Byte *)0x0;
    }
    UA_copy(&request->clientNonce,p,UA_TYPES + 0xe);
    UA_copy(&pUVar3->serverNonce,&response->serverNonce,UA_TYPES + 0xe);
    UVar1 = (pUVar3->nextSecurityToken).tokenId;
    UVar4 = (pUVar3->nextSecurityToken).createdAt;
    (response->securityToken).channelId = (pUVar3->nextSecurityToken).channelId;
    (response->securityToken).tokenId = UVar1;
    (response->securityToken).createdAt = UVar4;
    uVar5 = *(undefined4 *)&(pUVar3->nextSecurityToken).field_0x14;
    (response->securityToken).revisedLifetime = (pUVar3->nextSecurityToken).revisedLifetime;
    *(undefined4 *)&(response->securityToken).field_0x14 = uVar5;
    clock_gettime(4,(timespec *)local_40);
    (pUVar3->nextSecurityToken).createdAt = tv.tv_sec / 100 + (long)local_40 * 10000000;
    UVar7 = 0;
  }
  return UVar7;
}

Assistant:

UA_StatusCode
UA_SecureChannelManager_renew(UA_SecureChannelManager *cm, UA_Connection *conn,
                              const UA_OpenSecureChannelRequest *request,
                              UA_OpenSecureChannelResponse *response) {
    UA_SecureChannel *channel = conn->channel;
    if(!channel)
        return UA_STATUSCODE_BADINTERNALERROR;

    /* if no security token is already issued */
    if(channel->nextSecurityToken.tokenId == 0) {
        channel->nextSecurityToken.channelId = channel->securityToken.channelId;
        channel->nextSecurityToken.tokenId = cm->lastTokenId++;
        channel->nextSecurityToken.createdAt = UA_DateTime_now();
        channel->nextSecurityToken.revisedLifetime =
            (request->requestedLifetime > cm->server->config.maxSecurityTokenLifetime) ?
            cm->server->config.maxSecurityTokenLifetime : request->requestedLifetime;
        if(channel->nextSecurityToken.revisedLifetime == 0) /* lifetime 0 -> return the max lifetime */
            channel->nextSecurityToken.revisedLifetime = cm->server->config.maxSecurityTokenLifetime;
    }

    /* invalidate the old nonce */
    if(channel->clientNonce.data)
        UA_ByteString_deleteMembers(&channel->clientNonce);

    /* set the response */
    UA_ByteString_copy(&request->clientNonce, &channel->clientNonce);
    UA_ByteString_copy(&channel->serverNonce, &response->serverNonce);
    UA_ChannelSecurityToken_copy(&channel->nextSecurityToken, &response->securityToken);

    /* reset the creation date to the monotonic clock */
    channel->nextSecurityToken.createdAt = UA_DateTime_nowMonotonic();

    return UA_STATUSCODE_GOOD;
}